

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::GetChannels
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2i p,WrapMode2D wrapMode)

{
  PixelFormat PVar1;
  float *pfVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  span<const_unsigned_char> vin;
  span<float> vout;
  Point2i p_local;
  
  p_local = p;
  ImageChannelValues::ImageChannelValues
            (__return_storage_ptr__,(long)(int)(this->channelNames).nStored,0.0);
  bVar3 = RemapPixelCoords(&p_local,(Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                           wrapMode);
  if (bVar3) {
    sVar5 = (this->channelNames).nStored;
    PVar1 = this->format;
    uVar4 = (uint)sVar5;
    lVar10 = (long)(int)((p_local.super_Tuple2<pbrt::Point2,_int>.y *
                          (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                         p_local.super_Tuple2<pbrt::Point2,_int>.x) * uVar4);
    if (PVar1 == U256) {
      paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      vin.n = (size_t)(int)uVar4;
      paVar7 = &(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar6 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar7 = paVar6;
      }
      vin.ptr = (this->p8).ptr + lVar10;
      vout.n = vin.n;
      vout.ptr = (float *)paVar7;
      ColorEncodingHandle::ToLinear(&this->encoding,vin,vout);
    }
    else if (PVar1 == Half) {
      lVar10 = lVar10 * 2;
      for (lVar9 = 0; lVar9 < (int)sVar5; lVar9 = lVar9 + 1) {
        fVar11 = Half::operator_cast_to_float((Half *)((long)&((this->p16).ptr)->h + lVar10));
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        if (paVar6 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)0x0) {
          paVar6 = &(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2
          ;
        }
        lVar10 = lVar10 + 2;
        paVar6->fixed[lVar9] = fVar11;
        sVar5 = (this->channelNames).nStored;
      }
    }
    else {
      if (PVar1 != Float) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                 ,0x20e,"Unhandled PixelFormat");
      }
      paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      pfVar2 = (this->p32).ptr;
      paVar7 = &(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar6 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar7 = paVar6;
      }
      for (uVar8 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar8; uVar8 = uVar8 + 1) {
        paVar7->fixed[uVar8] = pfVar2[lVar10 + uVar8];
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::GetChannels(Point2i p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    if (!RemapPixelCoords(&p, resolution, wrapMode))
        return cv;

    size_t pixelOffset = PixelOffset(p);
    switch (format) {
    case PixelFormat::U256: {
        encoding.ToLinear({&p8[pixelOffset], size_t(NChannels())},
                          {&cv[0], size_t(NChannels())});
        break;
    }
    case PixelFormat::Half: {
        for (int i = 0; i < NChannels(); ++i)
            cv[i] = Float(p16[pixelOffset + i]);
        break;
    }
    case PixelFormat::Float: {
        for (int i = 0; i < NChannels(); ++i)
            cv[i] = p32[pixelOffset + i];
        break;
    }
    default:
        LOG_FATAL("Unhandled PixelFormat");
    }

    return cv;
}